

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alsa.c
# Opt level: O2

void * alsa_update_rw(ALLEGRO_THREAD *self,void *arg)

{
  ALLEGRO_AUDIO_DEPTH depth;
  ALLEGRO_CHANNEL_CONF chan_conf;
  uint *puVar1;
  ALLEGRO_MUTEX *mutex;
  char cVar2;
  int iVar3;
  undefined4 uVar4;
  ulong uVar5;
  undefined1 *puVar6;
  long lVar7;
  undefined8 uVar8;
  undefined1 **ppuVar9;
  undefined1 *buf;
  uint samples;
  ulong uVar10;
  undefined1 *local_48;
  undefined8 local_40;
  uint iframes;
  int local_34;
  int bytes;
  
  puVar1 = *(uint **)((long)arg + 0x50);
  cVar2 = _al_trace_prefix("alsa",1,
                           "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                           ,0x1a5,"alsa_update_rw");
  if (cVar2 != '\0') {
    _al_trace_suffix("ALSA update_rw thread started\n");
  }
  local_34 = -1;
  ppuVar9 = &local_48;
LAB_0010ff08:
  do {
    *(undefined8 *)((long)ppuVar9 + -8) = 0x10ff10;
    cVar2 = al_get_thread_should_stop(self);
    if (cVar2 != '\0') {
LAB_001101c7:
      *(undefined8 *)((long)ppuVar9 + -8) = 1;
      uVar8 = *(undefined8 *)((long)ppuVar9 + -8);
      *(undefined8 *)((long)ppuVar9 + -8) = 0x1101e9;
      cVar2 = _al_trace_prefix("alsa",uVar8,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                               ,0x1ff,"alsa_update_rw");
      if (cVar2 != '\0') {
        *(undefined8 *)((long)ppuVar9 + -8) = 0x1101fb;
        _al_trace_suffix("ALSA update_rw thread stopped\n");
      }
      return (void *)0x0;
    }
    if ((*(char *)((long)puVar1 + 0x11) == '\x01') && (*(char *)((long)puVar1 + 0x12) == '\0')) {
      uVar8 = *(undefined8 *)(puVar1 + 0xc);
      *(undefined8 *)((long)ppuVar9 + -8) = 0x10ff30;
      snd_pcm_drop(uVar8);
      uVar8 = *(undefined8 *)((long)arg + 0x30);
      *(undefined8 *)((long)ppuVar9 + -8) = 0x10ff39;
      al_lock_mutex(uVar8);
      *(undefined1 *)((long)puVar1 + 0x12) = 1;
      uVar8 = *(undefined8 *)((long)arg + 0x38);
      *(undefined8 *)((long)ppuVar9 + -8) = 0x10ff47;
      al_signal_cond(uVar8);
      uVar8 = *(undefined8 *)((long)arg + 0x30);
      *(undefined8 *)((long)ppuVar9 + -8) = 0x10ff50;
      al_unlock_mutex(uVar8);
    }
    if ((*(char *)((long)puVar1 + 0x11) == '\0') && (*(char *)((long)puVar1 + 0x12) == '\x01')) {
      *(undefined1 *)((long)puVar1 + 0x12) = 0;
    }
    if (*(char *)((long)puVar1 + 0x12) != '\x01') {
      uVar8 = *(undefined8 *)(puVar1 + 0xc);
      *(undefined8 *)((long)ppuVar9 + -8) = 0x10ffaf;
      iVar3 = snd_pcm_state(uVar8);
      if (iVar3 != local_34) {
        *(undefined8 *)((long)ppuVar9 + -8) = 0x10ffd8;
        cVar2 = _al_trace_prefix("alsa",0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                 ,0x1c1,"alsa_update_rw");
        if (cVar2 != '\0') {
          *(undefined8 *)((long)ppuVar9 + -8) = 0x10ffe4;
          snd_pcm_state_name(iVar3);
          *(undefined8 *)((long)ppuVar9 + -8) = 0x10fff5;
          _al_trace_suffix("state changed to: %s\n");
        }
        local_34 = iVar3;
      }
      if (iVar3 == 2) {
        uVar8 = *(undefined8 *)(puVar1 + 0xc);
        *(undefined8 *)((long)ppuVar9 + -8) = 0x11005d;
        uVar4 = snd_pcm_start(uVar8);
        *(undefined8 *)((long)ppuVar9 + -8) = 0x110081;
        cVar2 = _al_trace_prefix("alsa",0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                 ,0x1cb,"alsa_update_rw");
        if (cVar2 != '\0') {
          *(undefined8 *)((long)ppuVar9 + -8) = 0x110096;
          _al_trace_suffix("snd_pcm_start returned: %d\n",uVar4);
        }
      }
      else if (iVar3 == 1) {
        uVar8 = *(undefined8 *)(puVar1 + 0xc);
        *(undefined8 *)((long)ppuVar9 + -8) = 0x110012;
        snd_pcm_prepare(uVar8);
        *(undefined8 *)((long)ppuVar9 + -8) = 0x110036;
        cVar2 = _al_trace_prefix("alsa",0,
                                 "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                 ,0x1c6,"alsa_update_rw");
        if (cVar2 != '\0') {
          *(undefined8 *)((long)ppuVar9 + -8) = 0x11004f;
          _al_trace_suffix("snd_pcm_prepare returned: %d\n");
        }
        goto LAB_0010ff08;
      }
      uVar8 = *(undefined8 *)(puVar1 + 0xc);
      *(undefined8 *)((long)ppuVar9 + -8) = 10;
      *(undefined8 *)((long)ppuVar9 + -8) = 0x1100a2;
      snd_pcm_wait(uVar8);
      uVar8 = *(undefined8 *)(puVar1 + 0xc);
      *(undefined8 *)((long)ppuVar9 + -8) = 0x1100ab;
      uVar5 = snd_pcm_avail_update(uVar8);
      if ((long)uVar5 < 0) {
        if (uVar5 != 0xffffffffffffffe0) {
          *(undefined8 *)((long)ppuVar9 + -8) = 2;
          uVar8 = *(undefined8 *)((long)ppuVar9 + -8);
          *(undefined8 *)((long)ppuVar9 + -8) = 0x1101a7;
          cVar2 = _al_trace_prefix("alsa",uVar8,
                                   "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/addons/audio/alsa.c"
                                   ,0x1d5,"alsa_update_rw");
          if (cVar2 != '\0') {
            *(undefined8 *)((long)ppuVar9 + -8) = 0x1101b6;
            uVar8 = snd_strerror(-(int)uVar5);
            *(undefined8 *)((long)ppuVar9 + -8) = 0x1101c7;
            _al_trace_suffix("Alsa r/w thread exited with error code %s.\n",uVar8);
          }
          goto LAB_001101c7;
        }
        uVar8 = *(undefined8 *)(puVar1 + 0xc);
        *(undefined8 *)((long)ppuVar9 + -8) = 0x1100cd;
        snd_pcm_prepare(uVar8);
      }
      else if (uVar5 == 0) goto LAB_0010ff08;
      uVar10 = *(ulong *)(puVar1 + 2);
      if (uVar5 < *(ulong *)(puVar1 + 2)) {
        uVar10 = uVar5;
      }
      samples = (uint)uVar10;
      iframes = *puVar1 * samples;
      buf = (undefined1 *)((long)ppuVar9 + -((ulong)iframes + 0xf & 0xfffffffffffffff0));
      local_48 = (undefined1 *)ppuVar9;
      if (*(char *)((long)arg + 0x28) == '\0') {
        if (*(char *)((long)puVar1 + 0x12) != '\0') goto LAB_0011012c;
        *(undefined8 *)(buf + -8) = 0x11014e;
        alsa_update_nonstream_voice((ALLEGRO_VOICE *)arg,(void **)&local_40,(int *)&iframes);
        uVar10 = (ulong)iframes / (ulong)*puVar1;
        puVar6 = (undefined1 *)CONCAT44(local_40._4_4_,(uint)local_40);
      }
      else {
        if (*(char *)((long)puVar1 + 0x12) == '\0') {
          mutex = *(ALLEGRO_MUTEX **)((long)arg + 0x30);
          local_40._0_4_ = samples;
          *(undefined8 *)(buf + -8) = 0x11011a;
          puVar6 = (undefined1 *)_al_voice_update((ALLEGRO_VOICE *)arg,mutex,(uint *)&local_40);
          if (puVar6 != (undefined1 *)0x0) {
            uVar10 = (ulong)(uint)local_40;
            goto LAB_0011015e;
          }
        }
LAB_0011012c:
        depth = *arg;
        chan_conf = *(ALLEGRO_CHANNEL_CONF *)((long)arg + 4);
        *(undefined8 *)(buf + -8) = 0x11013c;
        al_fill_silence(buf,samples,depth,chan_conf);
        puVar6 = buf;
      }
LAB_0011015e:
      uVar8 = *(undefined8 *)(puVar1 + 0xc);
      *(undefined8 *)(buf + -8) = 0x11016d;
      lVar7 = snd_pcm_writei(uVar8,puVar6,uVar10);
      ppuVar9 = (undefined1 **)local_48;
      if (lVar7 == -0x20) {
        uVar8 = *(undefined8 *)(puVar1 + 0xc);
        *(undefined8 *)(buf + -8) = 0x11017c;
        snd_pcm_prepare(uVar8);
        ppuVar9 = (undefined1 **)local_48;
      }
      goto LAB_0010ff08;
    }
    uVar8 = *(undefined8 *)((long)arg + 0x30);
    *(undefined8 *)((long)ppuVar9 + -8) = 0x10ff75;
    al_lock_mutex(uVar8);
    while (*(char *)((long)puVar1 + 0x11) == '\x01') {
      *(undefined8 *)((long)ppuVar9 + -8) = 0x10ff85;
      cVar2 = al_get_thread_should_stop(self);
      if (cVar2 != '\0') break;
      uVar8 = *(undefined8 *)((long)arg + 0x38);
      *(undefined8 *)((long)ppuVar9 + -8) = 0x10ff96;
      al_wait_cond(uVar8);
    }
    uVar8 = *(undefined8 *)((long)arg + 0x30);
    *(undefined8 *)((long)ppuVar9 + -8) = 0x10ffa1;
    al_unlock_mutex(uVar8);
  } while( true );
}

Assistant:

static void *alsa_update_rw(ALLEGRO_THREAD *self, void *arg)
{
   ALLEGRO_VOICE *voice = (ALLEGRO_VOICE*)arg;
   ALSA_VOICE *alsa_voice = (ALSA_VOICE*)voice->extra;
   snd_pcm_state_t last_state = -1;
   snd_pcm_state_t state;
   snd_pcm_uframes_t frames;
   snd_pcm_sframes_t err;

   ALLEGRO_INFO("ALSA update_rw thread started\n");

   while (!al_get_thread_should_stop(self)) {
      if (alsa_voice->stop && !alsa_voice->stopped) {
         snd_pcm_drop(alsa_voice->pcm_handle);
         al_lock_mutex(voice->mutex);
         alsa_voice->stopped = true;
         al_signal_cond(voice->cond);
         al_unlock_mutex(voice->mutex);
      }

      if (!alsa_voice->stop && alsa_voice->stopped) {
         alsa_voice->stopped = false;
      }

      if (alsa_voice->stopped) {
         /* Keep waiting while the voice is supposed to be stopped but present.
          */
         al_lock_mutex(voice->mutex);
         while (alsa_voice->stop && !al_get_thread_should_stop(self)) {
            al_wait_cond(voice->cond, voice->mutex);
         }
         al_unlock_mutex(voice->mutex);
         continue;
      }

      state = snd_pcm_state(alsa_voice->pcm_handle);
      if (state != last_state) {
         ALLEGRO_DEBUG("state changed to: %s\n", snd_pcm_state_name(state));
         last_state = state;
      }
      if (state == SND_PCM_STATE_SETUP) {
         int rc = snd_pcm_prepare(alsa_voice->pcm_handle);
         ALLEGRO_DEBUG("snd_pcm_prepare returned: %d\n", rc);
         continue;
      }
      if (state == SND_PCM_STATE_PREPARED) {
         int rc = snd_pcm_start(alsa_voice->pcm_handle);
         ALLEGRO_DEBUG("snd_pcm_start returned: %d\n", rc);
      }

      snd_pcm_wait(alsa_voice->pcm_handle, 10);
      err = snd_pcm_avail_update(alsa_voice->pcm_handle);
      if (err < 0) {
         if (err == -EPIPE) {
            snd_pcm_prepare(alsa_voice->pcm_handle);
         }
         else {
            ALLEGRO_WARN("Alsa r/w thread exited "
               "with error code %s.\n", snd_strerror(-err));
            break;
         }
      }
      if (err == 0) {
         continue;
      }
      frames = err;
      if (frames > alsa_voice->frag_len)
         frames = alsa_voice->frag_len;
      /* Write sample data into the buffer. */
      int bytes = frames * alsa_voice->frame_size;
      uint8_t data[bytes];
      void *buf;
      if (!voice->is_streaming && !alsa_voice->stopped) {
         ASSERT(!alsa_voice->reversed); // FIXME
         alsa_update_nonstream_voice(voice, &buf, &bytes);
         frames = bytes / alsa_voice->frame_size;
      }
      else if (voice->is_streaming && !alsa_voice->stopped) {
         /* This should fit. */
         unsigned int iframes = frames;
         buf = (void *)_al_voice_update(voice, voice->mutex, &iframes);
         if (buf == NULL)
            goto silence;
         frames = iframes;
      }
      else {
silence:
         /* If stopped just fill with silence. */
         al_fill_silence(data, frames, voice->depth, voice->chan_conf);
         buf = data;
      }
      err = snd_pcm_writei(alsa_voice->pcm_handle, buf, frames);
      if (err < 0) {
         if (err == -EPIPE) {
            snd_pcm_prepare(alsa_voice->pcm_handle);
         }
      }
   }

   ALLEGRO_INFO("ALSA update_rw thread stopped\n");

   return NULL;
}